

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codepage.cpp
# Opt level: O0

string * booster::locale::conv::impl::normalize_encoding_abi_cxx11_(char *ccharset)

{
  char cVar1;
  char *pcVar2;
  char *in_RSI;
  string *in_RDI;
  char c;
  string *charset;
  char *local_10;
  
  std::__cxx11::string::string((string *)in_RDI);
  strlen(in_RSI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_10 = in_RSI;
  while (*local_10 != '\0') {
    pcVar2 = local_10 + 1;
    cVar1 = *local_10;
    local_10 = pcVar2;
    if ((cVar1 < '0') || ('9' < cVar1)) {
      if ((cVar1 < 'a') || ('z' < cVar1)) {
        if (('@' < cVar1) && (cVar1 < '[')) {
          std::__cxx11::string::operator+=((string *)in_RDI,cVar1 + ' ');
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,cVar1);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)in_RDI,cVar1);
    }
  }
  return in_RDI;
}

Assistant:

std::string normalize_encoding(char const *ccharset)
                {
                    std::string charset;
                    charset.reserve(std::strlen(ccharset));
                    while(*ccharset!=0) {
                        char c=*ccharset++;
                        if('0' <= c && c<= '9')
                            charset+=c;
                        else if('a' <=c && c <='z')
                            charset+=c;
                        else if('A' <=c && c <='Z')
                            charset+=char(c-'A'+'a');
                    }
                    return charset;
                }